

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall ON_SimpleArray<double>::Append(ON_SimpleArray<double> *this,double *x)

{
  double dVar1;
  int iVar2;
  void *temp;
  double *pdStack_20;
  int newcapacity;
  double *p;
  double *x_local;
  ON_SimpleArray<double> *this_local;
  
  pdStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pdStack_20 = (double *)onmalloc(8);
      *pdStack_20 = *x;
    }
    Reserve(this,(long)iVar2);
    if (this->m_a == (double *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  dVar1 = *pdStack_20;
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  this->m_a[iVar2] = dVar1;
  if (pdStack_20 != x) {
    onfree(pdStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}